

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void init_mode_skip_mask(mode_skip_mask_t *mask,AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  byte in_CL;
  long in_RDX;
  long in_RSI;
  uint *in_RDI;
  bool bVar4;
  int dir;
  int is_closest_ref;
  RefFrameDistanceInfo *ref_frame_dist_info;
  double prune_threshes [2];
  int ref_idx;
  int prune_ref_list [2];
  int sad_thresh_1;
  MV_REFERENCE_FRAME start_frame;
  int sad_thresh;
  int_mv global_mv;
  int_mv nearest_mv;
  int_mv near_mv;
  MV_REFERENCE_FRAME tmp_ref_frames [2];
  MV_REFERENCE_FRAME ref;
  int r_idx;
  int num_rt_refs;
  MV_REFERENCE_FRAME ref_frame;
  int min_pred_mv_sad;
  REF_SET ref_set;
  INTER_MODE_SPEED_FEATURES *inter_sf;
  SPEED_FEATURES *sf;
  uchar segment_id;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  segmentation *seg;
  AV1_COMMON *cm;
  MV_REFERENCE_FRAME *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  PREDICTION_MODE this_mode;
  undefined4 in_stack_ffffffffffffff48;
  REF_SET in_stack_ffffffffffffff4c;
  mode_skip_mask_t *in_stack_ffffffffffffff50;
  double local_a8;
  MB_MODE_INFO_EXT *in_stack_ffffffffffffff60;
  int local_94;
  undefined8 local_90;
  int local_88;
  char local_81;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  undefined2 local_6f;
  char local_6d;
  int local_6c;
  undefined4 local_68;
  char local_61;
  int local_60;
  uint local_5c;
  long local_58;
  long local_50;
  byte local_41;
  long local_40;
  long local_38;
  segmentation *local_30;
  long local_28;
  byte local_19;
  long local_18;
  long local_10;
  uint *local_8;
  
  local_28 = in_RSI + 0x3bf80;
  local_30 = (segmentation *)(in_RSI + 0x409b8);
  local_38 = in_RDX + 0x1a0;
  local_40 = **(long **)(in_RDX + 0x2058);
  local_41 = (byte)*(undefined2 *)(local_40 + 0xa7) & 7;
  local_50 = in_RSI + 0x608c0;
  local_58 = in_RSI + 0x60a74;
  if (*(int *)(in_RSI + 0x60cc8) == 0) {
    local_5c = (uint)((*(byte *)(in_RSI + 0x426d8) & 1) != 0);
  }
  else {
    local_5c = 2;
  }
  local_19 = in_CL;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  default_skip_mask(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  local_60 = 0x7fffffff;
  if (local_5c == 2) {
    local_68 = 4;
    for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
      local_6d = real_time_ref_combos[local_6c][0];
      if ((local_6d != '\0') &&
         (in_stack_ffffffffffffff44 = local_60,
         *(int *)(local_18 + 0x15d70 + (long)local_6d * 4) <= local_60)) {
        local_60 = *(int *)(local_18 + 0x15d70 + (long)local_6d * 4);
        in_stack_ffffffffffffff44 = local_60;
      }
    }
  }
  else {
    for (local_61 = '\x01'; local_61 < '\b'; local_61 = local_61 + '\x01') {
      if (*(int *)(local_18 + 0x15d70 + (long)local_61 * 4) <= local_60) {
        local_60 = *(int *)(local_18 + 0x15d70 + (long)local_61 * 4);
      }
      in_stack_ffffffffffffff40 = local_60;
    }
  }
  for (local_61 = '\x01'; this_mode = (PREDICTION_MODE)((uint)in_stack_ffffffffffffff44 >> 0x18),
      local_61 < '\b'; local_61 = local_61 + '\x01') {
    if ((*(uint *)(local_10 + 0x608b8) & (uint)""[local_61]) == 0) {
      disable_reference(local_61,(_Bool (*) [9])(local_8 + 8));
    }
    else if (local_60 < *(int *)(local_18 + 0x15d70 + (long)local_61 * 4) >> 2) {
      local_8[local_61] = local_8[local_61] | 0xfee000;
    }
    iVar1 = segfeature_active(local_30,local_41,'\x05');
    if ((iVar1 != 0) && (iVar1 = get_segdata(local_30,(uint)local_41,'\x05'), iVar1 != local_61)) {
      disable_reference(local_61,(_Bool (*) [9])(local_8 + 8));
    }
  }
  iVar1 = segfeature_active(local_30,local_41,'\x05');
  if (((iVar1 == 0) && (*(int *)(local_10 + 0x607a8) != 0)) && (*(int *)(local_10 + 0x42358) == 0))
  {
    disable_inter_references_except_altref((_Bool (*) [9])0x2e5ec0);
    local_8[7] = 0xff011fff;
    local_6f = 0xff07;
    get_this_mv((int_mv *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),this_mode,
                in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                in_stack_ffffffffffffff30,in_stack_ffffffffffffff60);
    get_this_mv((int_mv *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),this_mode,
                in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                in_stack_ffffffffffffff30,in_stack_ffffffffffffff60);
    get_this_mv((int_mv *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),this_mode,
                in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                in_stack_ffffffffffffff30,in_stack_ffffffffffffff60);
    if (local_74 != local_7c) {
      local_8[7] = local_8[7] | 0x4000;
    }
    if (local_78 != local_7c) {
      local_8[7] = local_8[7] | 0x2000;
    }
  }
  if (((*(int *)(local_10 + 0x607a8) != 0) && (*(int *)(local_58 + 0x24) != 0)) &&
     ((*(uint *)(local_10 + 0x608b8) & 0x40) != 0)) {
    local_8[7] = 0;
    disable_inter_references_except_altref((_Bool (*) [9])0x2e6003);
    disable_reference('\0',(_Bool (*) [9])(local_8 + 8));
  }
  if (((*(int *)(local_58 + 0x24) != 0) && (*(int *)(local_28 + 0x1e0) == 0)) &&
     (*(int *)(local_18 + 0x15d90) < 0x7fffffff)) {
    local_80 = *(int *)(local_18 + 0x15d90) + (*(int *)(local_18 + 0x15d90) >> 3);
    local_81 = '\x05';
    if (*(int *)(local_58 + 0x24) == 1) {
      local_81 = '\x06';
    }
    for (local_61 = local_81; local_61 < '\b'; local_61 = local_61 + '\x01') {
      if (*(int *)(local_10 + 0x9d308 + (long)(local_61 + -1) * 4) < 0) {
        if (*(int *)(local_58 + 0x24) == 1) {
          iVar1 = *(int *)(local_10 + 0x9d308 + (long)(local_61 + -1) * 4);
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          iVar2 = *(int *)(local_10 + 0x9d308);
          if (iVar2 < 1) {
            iVar2 = -iVar2;
          }
          if ((double)iVar2 * 1.5 < (double)iVar1) goto LAB_002e616b;
        }
        if (local_80 < *(int *)(local_18 + 0x15d70 + (long)local_61 * 4)) {
          local_8[local_61] = local_8[local_61] | 0x1ffe000;
        }
      }
LAB_002e616b:
    }
  }
  if ((*(int *)(local_50 + 0x4b8) != 0) && (*(int *)(local_18 + 0x15d90) < 0x7fffffff)) {
    local_88 = *(int *)(local_18 + 0x15d90) + (*(int *)(local_18 + 0x15d90) >> 1);
    local_90 = 0x700000004;
    for (local_94 = 0; local_94 < 2; local_94 = local_94 + 1) {
      local_61 = (char)*(undefined4 *)((long)&local_90 + (long)local_94 * 4);
      if (local_88 < *(int *)(local_18 + 0x15d70 + (long)local_61 * 4)) {
        local_8[local_61] = local_8[local_61] | 0xfee000;
      }
    }
  }
  if (*(byte *)(local_50 + 0xe4) < local_19) {
    disable_reference('\0',(_Bool (*) [9])(local_8 + 8));
  }
  if ((*(byte *)(local_10 + 0x4244b) & 1) == 0) {
    for (local_61 = '\x01'; local_61 < '\b'; local_61 = local_61 + '\x01') {
      local_8[local_61] = local_8[local_61] | 0x8000;
      local_8[local_61] = local_8[local_61] | 0x800000;
    }
  }
  *local_8 = *(uint *)(local_50 + 0x29c + (ulong)""[local_19] * 4) ^ 0xffffffff | *local_8;
  if (*(int *)(local_58 + 0x28) != 0) {
    local_a8 = 1.2;
    for (local_61 = '\x01'; local_61 < '\b'; local_61 = local_61 + '\x01') {
      bVar4 = true;
      if (local_61 != *(char *)(local_10 + 0x9d324)) {
        bVar4 = local_61 == *(char *)(local_10 + 0x9d325);
      }
      if (((!bVar4) &&
          (uVar3 = (uint)(-1 < *(int *)(local_10 + 0x9d308 + (long)(local_61 + -1) * 4)),
          *(int *)(local_18 + 0x15d90 + (long)(int)uVar3 * 4) < 0x7fffffff)) &&
         ((&local_a8)[*(int *)(local_58 + 0x28) + -1] *
          (double)*(int *)(local_18 + 0x15d90 + (long)(int)uVar3 * 4) <
          (double)*(int *)(local_18 + 0x15d70 + (long)local_61 * 4))) {
        local_8[local_61] = local_8[local_61] | 0x1e000;
      }
    }
  }
  return;
}

Assistant:

static inline void init_mode_skip_mask(mode_skip_mask_t *mask,
                                       const AV1_COMP *cpi, MACROBLOCK *x,
                                       BLOCK_SIZE bsize) {
  const AV1_COMMON *const cm = &cpi->common;
  const struct segmentation *const seg = &cm->seg;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  unsigned char segment_id = mbmi->segment_id;
  const SPEED_FEATURES *const sf = &cpi->sf;
  const INTER_MODE_SPEED_FEATURES *const inter_sf = &sf->inter_sf;
  REF_SET ref_set = REF_SET_FULL;

  if (sf->rt_sf.use_real_time_ref_set)
    ref_set = REF_SET_REALTIME;
  else if (cpi->oxcf.ref_frm_cfg.enable_reduced_reference_set)
    ref_set = REF_SET_REDUCED;

  default_skip_mask(mask, ref_set);

  int min_pred_mv_sad = INT_MAX;
  MV_REFERENCE_FRAME ref_frame;
  if (ref_set == REF_SET_REALTIME) {
    // For real-time encoding, we only look at a subset of ref frames. So the
    // threshold for pruning should be computed from this subset as well.
    const int num_rt_refs =
        sizeof(real_time_ref_combos) / sizeof(*real_time_ref_combos);
    for (int r_idx = 0; r_idx < num_rt_refs; r_idx++) {
      const MV_REFERENCE_FRAME ref = real_time_ref_combos[r_idx][0];
      if (ref != INTRA_FRAME) {
        min_pred_mv_sad = AOMMIN(min_pred_mv_sad, x->pred_mv_sad[ref]);
      }
    }
  } else {
    for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame)
      min_pred_mv_sad = AOMMIN(min_pred_mv_sad, x->pred_mv_sad[ref_frame]);
  }

  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    if (!(cpi->ref_frame_flags & av1_ref_frame_flag_list[ref_frame])) {
      // Skip checking missing reference in both single and compound reference
      // modes.
      disable_reference(ref_frame, mask->ref_combo);
    } else {
      // Skip fixed mv modes for poor references
      if ((x->pred_mv_sad[ref_frame] >> 2) > min_pred_mv_sad) {
        mask->pred_modes[ref_frame] |= INTER_NEAREST_NEAR_ZERO;
      }
    }
    if (segfeature_active(seg, segment_id, SEG_LVL_REF_FRAME) &&
        get_segdata(seg, segment_id, SEG_LVL_REF_FRAME) != (int)ref_frame) {
      // Reference not used for the segment.
      disable_reference(ref_frame, mask->ref_combo);
    }
  }
  // Note: We use the following drop-out only if the SEG_LVL_REF_FRAME feature
  // is disabled for this segment. This is to prevent the possibility that we
  // end up unable to pick any mode.
  if (!segfeature_active(seg, segment_id, SEG_LVL_REF_FRAME)) {
    // Only consider GLOBALMV/ALTREF_FRAME for alt ref frame,
    // unless ARNR filtering is enabled in which case we want
    // an unfiltered alternative. We allow near/nearest as well
    // because they may result in zero-zero MVs but be cheaper.
    if (cpi->rc.is_src_frame_alt_ref &&
        (cpi->oxcf.algo_cfg.arnr_max_frames == 0)) {
      disable_inter_references_except_altref(mask->ref_combo);

      mask->pred_modes[ALTREF_FRAME] = ~INTER_NEAREST_NEAR_ZERO;
      const MV_REFERENCE_FRAME tmp_ref_frames[2] = { ALTREF_FRAME, NONE_FRAME };
      int_mv near_mv, nearest_mv, global_mv;
      get_this_mv(&nearest_mv, NEARESTMV, 0, 0, 0, tmp_ref_frames,
                  &x->mbmi_ext);
      get_this_mv(&near_mv, NEARMV, 0, 0, 0, tmp_ref_frames, &x->mbmi_ext);
      get_this_mv(&global_mv, GLOBALMV, 0, 0, 0, tmp_ref_frames, &x->mbmi_ext);

      if (near_mv.as_int != global_mv.as_int)
        mask->pred_modes[ALTREF_FRAME] |= (1 << NEARMV);
      if (nearest_mv.as_int != global_mv.as_int)
        mask->pred_modes[ALTREF_FRAME] |= (1 << NEARESTMV);
    }
  }

  if (cpi->rc.is_src_frame_alt_ref) {
    if (inter_sf->alt_ref_search_fp &&
        (cpi->ref_frame_flags & av1_ref_frame_flag_list[ALTREF_FRAME])) {
      mask->pred_modes[ALTREF_FRAME] = 0;
      disable_inter_references_except_altref(mask->ref_combo);
      disable_reference(INTRA_FRAME, mask->ref_combo);
    }
  }

  if (inter_sf->alt_ref_search_fp) {
    if (!cm->show_frame && x->best_pred_mv_sad[0] < INT_MAX) {
      int sad_thresh = x->best_pred_mv_sad[0] + (x->best_pred_mv_sad[0] >> 3);
      // Conservatively skip the modes w.r.t. BWDREF, ALTREF2 and ALTREF, if
      // those are past frames
      MV_REFERENCE_FRAME start_frame =
          inter_sf->alt_ref_search_fp == 1 ? ALTREF2_FRAME : BWDREF_FRAME;
      for (ref_frame = start_frame; ref_frame <= ALTREF_FRAME; ref_frame++) {
        if (cpi->ref_frame_dist_info.ref_relative_dist[ref_frame - LAST_FRAME] <
            0) {
          // Prune inter modes when relative dist of ALTREF2 and ALTREF is close
          // to the relative dist of LAST_FRAME.
          if (inter_sf->alt_ref_search_fp == 1 &&
              (abs(cpi->ref_frame_dist_info
                       .ref_relative_dist[ref_frame - LAST_FRAME]) >
               1.5 * abs(cpi->ref_frame_dist_info
                             .ref_relative_dist[LAST_FRAME - LAST_FRAME]))) {
            continue;
          }
          if (x->pred_mv_sad[ref_frame] > sad_thresh)
            mask->pred_modes[ref_frame] |= INTER_ALL;
        }
      }
    }
  }

  if (sf->rt_sf.prune_inter_modes_wrt_gf_arf_based_on_sad) {
    if (x->best_pred_mv_sad[0] < INT_MAX) {
      int sad_thresh = x->best_pred_mv_sad[0] + (x->best_pred_mv_sad[0] >> 1);
      const int prune_ref_list[2] = { GOLDEN_FRAME, ALTREF_FRAME };

      // Conservatively skip the modes w.r.t. GOLDEN and ALTREF references
      for (int ref_idx = 0; ref_idx < 2; ref_idx++) {
        ref_frame = prune_ref_list[ref_idx];
        if (x->pred_mv_sad[ref_frame] > sad_thresh)
          mask->pred_modes[ref_frame] |= INTER_NEAREST_NEAR_ZERO;
      }
    }
  }

  if (bsize > sf->part_sf.max_intra_bsize) {
    disable_reference(INTRA_FRAME, mask->ref_combo);
  }

  if (!cpi->oxcf.tool_cfg.enable_global_motion) {
    for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
      mask->pred_modes[ref_frame] |= (1 << GLOBALMV);
      mask->pred_modes[ref_frame] |= (1 << GLOBAL_GLOBALMV);
    }
  }

  mask->pred_modes[INTRA_FRAME] |=
      ~(uint32_t)sf->intra_sf.intra_y_mode_mask[max_txsize_lookup[bsize]];

  // Prune reference frames which are not the closest to the current
  // frame and with large pred_mv_sad.
  if (inter_sf->prune_single_ref) {
    assert(inter_sf->prune_single_ref > 0 && inter_sf->prune_single_ref < 3);
    const double prune_threshes[2] = { 1.20, 1.05 };

    for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
      const RefFrameDistanceInfo *const ref_frame_dist_info =
          &cpi->ref_frame_dist_info;
      const int is_closest_ref =
          (ref_frame == ref_frame_dist_info->nearest_past_ref) ||
          (ref_frame == ref_frame_dist_info->nearest_future_ref);

      if (!is_closest_ref) {
        const int dir =
            (ref_frame_dist_info->ref_relative_dist[ref_frame - LAST_FRAME] < 0)
                ? 0
                : 1;
        if (x->best_pred_mv_sad[dir] < INT_MAX &&
            x->pred_mv_sad[ref_frame] >
                prune_threshes[inter_sf->prune_single_ref - 1] *
                    x->best_pred_mv_sad[dir])
          mask->pred_modes[ref_frame] |= INTER_SINGLE_ALL;
      }
    }
  }
}